

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::InlConstFoldArg(Inline *this,Instr *instr,Instr **callerArgOuts,ArgSlot callerArgOutCount)

{
  Instr *instr_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  RegOpnd *pRVar4;
  IntConstType local_38;
  IntConstType value;
  
  if (instr->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1223,"(instr->m_opcode == Js::OpCode::ArgOut_A)",
                       "instr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sourceContextId = Func::GetSourceContextId(instr->m_func->topFunc);
  functionId = Func::GetLocalFunctionId(instr->m_func->topFunc);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,InlinerConstFoldPhase,sourceContextId,functionId);
  if (!bVar2) {
    this_00 = Func::GetJITFunctionBody(instr->m_func);
    bVar2 = JITTimeFunctionBody::HasTry(this_00);
    if ((!bVar2) && (bVar2 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar2)) {
      pRVar4 = IR::Opnd::AsRegOpnd(instr->m_src1);
      instr_00 = (pRVar4->m_sym->field_5).m_instrDef;
      if ((instr_00 != (Instr *)0x0 & pRVar4->m_sym->field_0x18) == 1) {
        bVar2 = InlConstFold(this,instr_00,&local_38,callerArgOuts,callerArgOutCount);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Inline::InlConstFoldArg(IR::Instr *instr, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount)
{
    Assert(instr->m_opcode == Js::OpCode::ArgOut_A);

    if (PHASE_OFF(Js::InlinerConstFoldPhase, instr->m_func->GetTopFunc()))
    {
        return false;
    }
    if (instr->m_func->GetJITFunctionBody()->HasTry())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IntConstType value;

    if (!src1->IsRegOpnd())
    {
        return false;
    }

    StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if (!sym->IsSingleDef())
    {
        return false;
    }

    IR::Instr *instrDef = sym->GetInstrDef();
    if (!this->InlConstFold(instrDef, &value, callerArgOuts, callerArgOutCount))
    {
        return false;
    }
    return true;
}